

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O3

bool __thiscall
axl::sl::
Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>_>_>
::reserve(Array<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>_>_>
          *this,size_t count)

{
  int32_t *piVar1;
  FreeFunc *pFVar2;
  HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*> *pHVar3;
  Hdr *pHVar4;
  size_t sVar5;
  EVP_PKEY_CTX *dst;
  AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>
  *pAVar6;
  Hdr *pHVar7;
  Hdr *pHVar8;
  bool bVar9;
  Ptr<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>_>::Hdr>
  hdr;
  Ptr<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>_>::Hdr>
  local_38;
  
  pHVar8 = (this->
           super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>_>_>
           ).m_hdr;
  if (((pHVar8 == (Hdr *)0x0) || ((pHVar8->super_BufHdr).super_RefCount.m_refCount != 1)) ||
     (bVar9 = true, (pHVar8->super_BufHdr).m_bufferSize < count * 0x18)) {
    sVar5 = getAllocSize<4096ul>(count * 0x18);
    dst = (EVP_PKEY_CTX *)operator_new(sVar5 + 0x30,(nothrow_t *)&std::nothrow);
    *(undefined4 *)(dst + 0x10) = 0;
    *(undefined4 *)(dst + 0x14) = 1;
    *(size_t *)(dst + 0x18) = sVar5;
    *(undefined8 *)(dst + 0x20) = 0;
    *(undefined ***)dst = &PTR__Hdr_0019e400;
    *(code **)(dst + 8) = mem::deallocate;
    local_38.m_p = (Hdr *)0x0;
    local_38.m_refCount = (RefCount *)0x0;
    rc::
    Ptr<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>_>::Hdr>
    ::copy(&local_38,dst,dst);
    bVar9 = local_38.m_p != (Hdr *)0x0;
    if (bVar9) {
      sVar5 = (this->
              super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>_>_>
              ).m_count;
      (local_38.m_p)->m_count = sVar5;
      pHVar8 = local_38.m_p + 1;
      if ((sVar5 != 0) && (0 < (long)sVar5)) {
        pAVar6 = (this->
                 super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>_>_>
                 ).m_p;
        pHVar7 = pHVar8;
        do {
          *(size_t *)&(pHVar7->super_BufHdr).super_RefCount.m_refCount =
               (pAVar6->
               super_ListBase<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>_>
               ).super_ListData<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>_>.
               m_count;
          pHVar3 = (pAVar6->
                   super_ListBase<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>_>
                   ).
                   super_ListData<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>_>
                   .m_tail;
          (pHVar7->super_BufHdr).super_RefCount._vptr_RefCount =
               (_func_int **)
               (pAVar6->
               super_ListBase<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink,_axl::sl::Iterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>,_axl::sl::ConstIterator<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>_>
               ).super_ListData<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>_>.
               m_head;
          (pHVar7->super_BufHdr).super_RefCount.m_freeFunc = (FreeFunc *)pHVar3;
          pHVar7 = (Hdr *)&(pHVar7->super_BufHdr).m_bufferSize;
          pAVar6 = pAVar6 + 1;
        } while (pHVar7 < &(pHVar8->super_BufHdr).super_RefCount + sVar5);
      }
      pHVar7 = (this->
               super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>_>_>
               ).m_hdr;
      if (pHVar7 != (Hdr *)0x0) {
        LOCK();
        piVar1 = &(pHVar7->super_BufHdr).super_RefCount.m_refCount;
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 == 0) {
          (**(pHVar7->super_BufHdr).super_RefCount._vptr_RefCount)(pHVar7);
          LOCK();
          piVar1 = &(pHVar7->super_BufHdr).super_RefCount.m_weakRefCount;
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if ((*piVar1 == 0) &&
             (pFVar2 = (pHVar7->super_BufHdr).super_RefCount.m_freeFunc, pFVar2 != (FreeFunc *)0x0))
          {
            (*pFVar2)(pHVar7);
          }
        }
      }
      pHVar4 = local_38.m_p;
      (this->
      super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>_>_>
      ).m_p = (AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>
               *)pHVar8;
      local_38.m_p = (Hdr *)0x0;
      local_38.m_refCount = (RefCount *)0x0;
      (this->
      super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>_>_>
      ).m_hdr = pHVar4;
    }
    rc::
    Ptr<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>,_axl::sl::HashTableEntry<axl::sl::Guid,_axl::err::ErrorProvider_*>::GetBucketLink>_>::Hdr>
    ::clear(&local_38);
  }
  return bVar9;
}

Assistant:

bool
	reserve(size_t count) {
		size_t size = count * sizeof(T);

		if (this->m_hdr &&
			this->m_hdr->getRefCount() == 1 &&
			this->m_hdr->m_bufferSize >= size)
			return true;

		size_t bufferSize = getAllocSize(size);

		rc::Ptr<Hdr> hdr = AXL_RC_NEW_ARGS_EXTRA(Hdr, (bufferSize), bufferSize);
		if (!hdr)
			return false;

		Details::setHdrCount(hdr, this->m_count);

		T* p = (T*)(hdr + 1);

		if (this->m_count)
			Details::constructCopy(p, this->m_p, this->m_count);

		if (this->m_hdr)
			this->m_hdr->release();

		this->m_p = p;
		this->m_hdr = hdr.detach();
		return true;
	}